

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderMps.cpp
# Opt level: O3

HighsStatus __thiscall
FilereaderMps::writeModelToFile
          (FilereaderMps *this,HighsOptions *options,string *filename,HighsModel *model)

{
  pointer pcVar1;
  HighsStatus HVar2;
  string local_40;
  
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + filename->_M_string_length);
  HVar2 = writeModelAsMps(options,&local_40,model,
                          (options->super_HighsOptionsStruct).mps_parser_type_free);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return HVar2;
}

Assistant:

HighsStatus FilereaderMps::writeModelToFile(const HighsOptions& options,
                                            const std::string filename,
                                            const HighsModel& model) {
  assert(model.lp_.a_matrix_.isColwise());
  return writeModelAsMps(options, filename, model,
                         options.mps_parser_type_free);
}